

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_normal.c
# Opt level: O1

bool_t prf_obsolete_vertex_with_normal_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  int32_t *piVar1;
  uint16_t uVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  uint len;
  bool_t bVar5;
  uint uVar6;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_obsolete_vertex_with_normal_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if ((4 < uVar2) && (node->data == (uint8_t *)0x0)) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar6 = 4;
        goto LAB_0010bc83;
      }
    }
    uVar6 = 4;
    if (7 < node->length) {
      piVar1 = (int32_t *)node->data;
      iVar3 = bf_get_int32_be(bfile);
      *piVar1 = iVar3;
      uVar6 = 8;
      if (0xb < node->length) {
        iVar3 = bf_get_int32_be(bfile);
        piVar1[1] = iVar3;
        uVar6 = 0xc;
        if (0xf < node->length) {
          iVar3 = bf_get_int32_be(bfile);
          piVar1[2] = iVar3;
          uVar6 = 0x10;
        }
      }
    }
    bVar5 = 1;
    len = node->length - uVar6;
    if (uVar6 <= node->length && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar6 - 4),len);
    }
  }
  else {
    prf_error(9,"tried vertex with normal (obs) load method for node of type %d.",(ulong)uVar2);
    uVar6 = 2;
LAB_0010bc83:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_obsolete_vertex_with_normal_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_obsolete_vertex_with_normal_info.opcode ) {
        prf_error( 9,
            "tried vertex with normal (obs) load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        data->x = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->z = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}